

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

void __thiscall
google::anon_unknown_1::FlagValue::FlagValue
          (FlagValue *this,void *valbuf,char *type,bool transfer_ownership_of_value)

{
  int iVar1;
  ulong uVar2;
  char *__s2;
  
  this->value_buffer_ = valbuf;
  this->owns_value_ = transfer_ownership_of_value;
  this->type_ = '\0';
  iVar1 = strcmp(type,"bool");
  if (iVar1 != 0) {
    uVar2 = 0xffffffffffffffff;
    __s2 = "int32";
    do {
      this->type_ = (char)uVar2 + '\x02';
      if (uVar2 == 5) goto LAB_0018fab2;
      iVar1 = strcmp(type,__s2);
      uVar2 = uVar2 + 1;
      __s2 = __s2 + 7;
    } while (iVar1 != 0);
    if (5 < uVar2) {
LAB_0018fab2:
      __assert_fail("type_ <= FV_MAX_INDEX",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                    ,0xfe,
                    "google::(anonymous namespace)::FlagValue::FlagValue(void *, const char *, bool)"
                   );
    }
  }
  return;
}

Assistant:

FlagValue::FlagValue(void* valbuf, const char* type,
                     bool transfer_ownership_of_value)
    : value_buffer_(valbuf),
      owns_value_(transfer_ownership_of_value) {
  for (type_ = 0; type_ <= FV_MAX_INDEX; ++type_) {
    if (!strcmp(type, TypeName())) {
      break;
    }
  }
  assert(type_ <= FV_MAX_INDEX);  // Unknown typename
}